

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_threads.c
# Opt level: O3

ares_status_t ares_channel_threading_init(ares_channel_t *channel)

{
  ares_thread_mutex_t *paVar1;
  ares_thread_cond_t *paVar2;
  
  paVar1 = ares_thread_mutex_create();
  channel->lock = paVar1;
  if (paVar1 != (ares_thread_mutex_t *)0x0) {
    paVar2 = ares_thread_cond_create();
    channel->cond_empty = paVar2;
    if (paVar2 != (ares_thread_cond_t *)0x0) {
      return ARES_SUCCESS;
    }
  }
  ares_channel_threading_destroy(channel);
  return ARES_ENOMEM;
}

Assistant:

ares_status_t ares_channel_threading_init(ares_channel_t *channel)
{
  ares_status_t status = ARES_SUCCESS;

  /* Threading is optional! */
  if (!ares_threadsafety()) {
    return ARES_SUCCESS;
  }

  channel->lock = ares_thread_mutex_create();
  if (channel->lock == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

  channel->cond_empty = ares_thread_cond_create();
  if (channel->cond_empty == NULL) {
    status = ARES_ENOMEM;
    goto done;
  }

done:
  if (status != ARES_SUCCESS) {
    ares_channel_threading_destroy(channel);
  }
  return status;
}